

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestingUtility.h
# Opt level: O2

bool __thiscall
BaseParticleFixture<pica::Particle<(pica::Dimension)2>>::
eqParticles_<pica::Particle<(pica::Dimension)2>,pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>>::ConstParticleRef>
          (BaseParticleFixture<pica::Particle<(pica::Dimension)2>> *this,
          Particle<(pica::Dimension)2> a,ConstParticleRef b)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  long lVar4;
  PositionType PVar5;
  ConstParticleRef local_58;
  MomentumType local_48;
  double local_30;
  double local_28;
  double local_20;
  
  dVar2 = a.position.x;
  dVar3 = a.position.y;
  local_58.particles = b.particles;
  local_58.idx = b.idx;
  PVar5 = pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>::ConstParticleRef::getPosition
                    (&local_58);
  if ((dVar2 == PVar5.x) && (!NAN(dVar2) && !NAN(PVar5.x))) {
    if ((dVar3 == PVar5.y) && (!NAN(dVar3) && !NAN(PVar5.y))) {
      pica::Particle<(pica::Dimension)2>::getMomentum(&a);
      pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>::ConstParticleRef::getMomentum
                (&local_48,&local_58);
      if ((local_30 == local_48.x) && (!NAN(local_30) && !NAN(local_48.x))) {
        if ((local_28 == local_48.y) && (!NAN(local_28) && !NAN(local_48.y))) {
          if ((local_20 == local_48.z) && (!NAN(local_20) && !NAN(local_48.z))) {
            dVar2 = *(double *)(pica::ParticleTypes::types + (long)a.typeIndex * 0x10);
            lVar4 = (long)((local_58.particles)->typeIndex).
                          super__Vector_base<short,_std::allocator<short>_>._M_impl.
                          super__Vector_impl_data._M_start[local_58.idx] * 0x10;
            pdVar1 = (double *)(pica::ParticleTypes::types + lVar4);
            if ((dVar2 == *pdVar1) && (!NAN(dVar2) && !NAN(*pdVar1))) {
              dVar2 = *(double *)(pica::ParticleTypes::types + 8 + (long)a.typeIndex * 0x10);
              pdVar1 = (double *)(pica::ParticleTypes::types + 8 + lVar4);
              if ((dVar2 == *pdVar1) && (!NAN(dVar2) && !NAN(*pdVar1))) {
                return (bool)(-(((local_58.particles)->factors).
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start[local_58.idx] == a.factor) & 1);
              }
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool eqParticles_(ConstParticleRef1 a, ConstParticleRef2 b) const
    {
        return (a.getPosition() == b.getPosition()) &&
            (a.getMomentum() == b.getMomentum()) &&
            (a.getMass() == b.getMass()) &&
            (a.getCharge() == b.getCharge()) &&
            (a.getFactor() == b.getFactor());
    }